

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

void __thiscall FxGetClass::FxGetClass(FxGetClass *this,FxExpression *self)

{
  FxExpression *self_local;
  FxGetClass *this_local;
  
  FxExpression::FxExpression(&this->super_FxExpression,EFX_GetClass,&self->ScriptPosition);
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxGetClass_00a0b2e8;
  this->Self = self;
  return;
}

Assistant:

FxGetClass::FxGetClass(FxExpression *self)
	:FxExpression(EFX_GetClass, self->ScriptPosition)
{
	Self = self;
}